

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrGLContext.cpp
# Opt level: O0

void __thiscall
sglr::GLContext::copyTexSubImage3D
          (GLContext *this,deUint32 target,int level,int xoffset,int yoffset,int zoffset,int x,int y
          ,int width,int height)

{
  code *pcVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  MessageBuilder *pMVar8;
  undefined4 extraout_var;
  int *piVar9;
  Enum<int,_2UL> EVar10;
  undefined1 local_1e8 [8];
  IVec2 offset;
  Enum<int,_2UL> local_1d0 [2];
  MessageBuilder local_1b0;
  int local_2c;
  int local_28;
  int zoffset_local;
  int yoffset_local;
  int xoffset_local;
  int level_local;
  deUint32 target_local;
  GLContext *this_local;
  
  local_2c = zoffset;
  local_28 = yoffset;
  zoffset_local = xoffset;
  yoffset_local = level;
  xoffset_local = target;
  _level_local = this;
  if ((this->m_logFlags & 1) != 0) {
    tcu::TestLog::operator<<(&local_1b0,this->m_log,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar8 = tcu::MessageBuilder::operator<<(&local_1b0,(char (*) [21])"glCopyTexSubImage3D(");
    EVar10 = glu::getTextureTargetStr(xoffset_local);
    offset.m_data = (int  [2])EVar10.m_getName;
    local_1d0[0].m_value = EVar10.m_value;
    local_1d0[0].m_getName = (GetNameFunc)offset.m_data;
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,local_1d0);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x12ed2ef);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&yoffset_local);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x12ed2ef);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&zoffset_local);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x12ed2ef);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_28);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x12ed2ef);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_2c);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x12ed2ef);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&x);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x12ed2ef);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&y);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x12ed2ef);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&width);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x12ed2ef);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&height);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x130f08e);
    tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b0);
  }
  getReadOffset((GLContext *)local_1e8);
  iVar7 = (*this->m_context->_vptr_RenderContext[3])();
  iVar6 = xoffset_local;
  iVar5 = yoffset_local;
  iVar4 = zoffset_local;
  iVar3 = local_28;
  iVar2 = local_2c;
  pcVar1 = *(code **)(CONCAT44(extraout_var,iVar7) + 0x368);
  piVar9 = tcu::Vector<int,_2>::x((Vector<int,_2> *)local_1e8);
  iVar7 = *piVar9 + x;
  piVar9 = tcu::Vector<int,_2>::y((Vector<int,_2> *)local_1e8);
  (*pcVar1)(iVar6,iVar5,iVar4,iVar3,iVar2,iVar7,*piVar9 + y,width,height);
  return;
}

Assistant:

void GLContext::copyTexSubImage3D (deUint32 target, int level, int xoffset, int yoffset, int zoffset, int x, int y, int width, int height)
{
	if ((m_logFlags & GLCONTEXT_LOG_CALLS) != 0)
		m_log << TestLog::Message << "glCopyTexSubImage3D("
								  << glu::getTextureTargetStr(target) << ", "
								  << level
								  << ", " << xoffset << ", " << yoffset << ", " << zoffset << ", "
								  << x << ", " << y << ", "
								  << width << ", " << height << ")"
			  << TestLog::EndMessage;

	tcu::IVec2 offset = getReadOffset();
	m_context.getFunctions().copyTexSubImage3D(target, level, xoffset, yoffset, zoffset, offset.x()+x, offset.y()+y, width, height);
}